

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

AssignBlock128
tcu::astc::anon_unknown_0::generateNormalBlock
          (NormalBlockParams *blockParams,int blockWidth,int blockHeight,
          NormalBlockISEInputs *iseInputs)

{
  deUint32 *pdVar1;
  int iVar2;
  ISEMode IVar3;
  NormalBlockParams *pNVar4;
  ISEInput *pIVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  deUint32 *pdVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined4 in_register_00000034;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  deUint32 *pdVar20;
  uint uVar21;
  deUint32 *pdVar22;
  long lVar23;
  ulong uVar24;
  int *piVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  AssignBlock128 AVar32;
  AssignBlock128 block;
  AssignBlock128 local_98;
  ulong local_80;
  NormalBlockParams *local_78;
  int local_70;
  ISEMode local_6c;
  ulong local_68;
  BitAssignAccessStream local_60;
  ISEParams *local_48;
  ISEInput *local_40;
  ISEParams local_38;
  ulong uVar19;
  
  local_98.m_words[0] = 0;
  local_98.m_words[1] = 0;
  iVar28 = blockParams->weightGridWidth;
  iVar17 = blockParams->weightGridHeight;
  bVar31 = blockParams->isDualPlane;
  local_80 = (ulong)bVar31;
  uVar11 = iVar17 * iVar28 << (bVar31 & 0x1fU);
  local_6c = (blockParams->weightISEParams).mode;
  if (local_6c == ISEMODE_PLAIN_BIT) {
    iVar14 = (blockParams->weightISEParams).numBits * uVar11;
  }
  else {
    if (local_6c == ISEMODE_QUINT) {
      iVar14 = (int)(uVar11 * 7) / 3;
      bVar30 = uVar11 * -0x55555553 + 0x2aaaaaaa < 0x55555555;
    }
    else {
      iVar14 = -1;
      if (local_6c != ISEMODE_TRIT) goto LAB_0060f12a;
      iVar14 = (int)(uVar11 * 8) / 5;
      bVar30 = uVar11 * 0x66666668 + 0x19999999 < 0x33333333;
    }
    iVar14 = (blockParams->weightISEParams).numBits * uVar11 + ((iVar14 + 1) - (uint)bVar30);
  }
LAB_0060f12a:
  if (local_6c == ISEMODE_PLAIN_BIT) {
    uVar6 = ~(-1 << ((byte)(blockParams->weightISEParams).numBits & 0x1f));
  }
  else {
    if (local_6c == ISEMODE_QUINT) {
      bVar8 = (byte)(blockParams->weightISEParams).numBits;
      iVar12 = 5;
    }
    else {
      uVar6 = 0xffffffff;
      if (local_6c != ISEMODE_TRIT) goto LAB_0060f164;
      bVar8 = (byte)(blockParams->weightISEParams).numBits;
      iVar12 = 3;
    }
    uVar6 = (iVar12 << (bVar8 & 0x1f)) - 1;
  }
LAB_0060f164:
  local_40 = (ISEInput *)CONCAT44(in_register_00000034,blockWidth);
  local_68 = (ulong)uVar11;
  local_70 = iVar14;
  uVar29 = 2;
  switch(uVar6) {
  case 1:
    break;
  case 2:
    uVar29 = 3;
    break;
  case 3:
    uVar29 = 4;
    break;
  case 4:
    uVar29 = 5;
    break;
  case 5:
    uVar29 = 6;
    break;
  case 6:
  case 8:
  case 10:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x14:
  case 0x15:
  case 0x16:
    goto switchD_0060f193_caseD_6;
  case 7:
    uVar29 = 7;
    break;
  case 9:
    goto switchD_0060f193_caseD_9;
  case 0xb:
    uVar29 = 3;
    goto switchD_0060f193_caseD_9;
  case 0xf:
    uVar29 = 4;
    goto switchD_0060f193_caseD_9;
  case 0x13:
    uVar29 = 5;
    goto switchD_0060f193_caseD_9;
  case 0x17:
    uVar29 = 6;
switchD_0060f193_caseD_9:
    uVar15 = 0x200;
    goto LAB_0060f201;
  default:
    if (uVar6 == 0x1f) {
      uVar29 = 7;
      goto switchD_0060f193_caseD_9;
    }
switchD_0060f193_caseD_6:
    uVar29 = 0xffffffff;
    uVar15 = 0x1fffffffe00;
    goto LAB_0060f201;
  }
  uVar15 = 0;
LAB_0060f201:
  local_48 = &blockParams->weightISEParams;
  uVar11 = 0xffffffff;
  piVar25 = &DAT_006a34d4;
  uVar24 = 0;
  uVar6 = 0xffffffff;
  do {
    local_60.m_dst =
         (AssignBlock128 *)((ulong)(uint)~(-1 << (*(byte *)(piVar25 + -5) & 0x1f)) << 0x20);
    local_60.m_startNdxInSrc = ~(-1 << (*(byte *)(piVar25 + -4) & 0x1f));
    iVar12 = piVar25[-2];
    bVar30 = true;
    if ((iVar12 <= iVar28) &&
       (uVar9 = piVar25[-3], iVar28 <= iVar12 + *(int *)((long)&local_60.m_dst + (ulong)uVar9 * 4)))
    {
      iVar2 = *piVar25;
      if (iVar2 <= iVar17) {
        uVar13 = piVar25[-1];
        if (iVar17 <= iVar2 + *(int *)((long)&local_60.m_dst + (ulong)uVar13 * 4)) {
          uVar16 = iVar28 - iVar12;
          if ((uVar9 != 1) && (uVar16 = uVar6, uVar9 == 2)) {
            uVar11 = iVar28 - iVar12;
          }
          uVar6 = iVar17 - iVar2;
          bVar30 = false;
          if (((ulong)uVar13 != 1) && (uVar6 = uVar16, bVar30 = false, uVar13 == 2)) {
            uVar11 = iVar17 - iVar2;
            bVar30 = false;
          }
        }
      }
    }
    if (!bVar30) goto LAB_0060f2c0;
    uVar24 = uVar24 + 1;
    piVar25 = piVar25 + 6;
  } while (uVar24 != 10);
  uVar24 = 10;
LAB_0060f2c0:
  if ((uint)uVar24 < 10) {
    uVar21 = uVar6 & 1;
    uVar16 = uVar6 >> 1 & 1;
    uVar6 = uVar11 & 1;
    uVar13 = uVar11 >> 1 & 1;
    uVar9 = (uint)uVar29 & 1;
    uVar18 = (uint)(uVar29 >> 1) & 1;
    uVar19 = (ulong)uVar18;
    uVar27 = (uint)uVar29 >> 2 & 1;
    uVar29 = (ulong)uVar27;
    switch(uVar24 & 0xffffffff) {
    case 0:
      local_98.m_words[0] =
           (uVar18 + uVar27 * 2 | uVar9 << 4) | uVar15 |
           (ulong)(uVar21 << 5) |
           (ulong)(uVar16 << 6) | (ulong)(uVar6 << 7) | (ulong)(uVar13 << 8) | (ulong)bVar31 << 10;
      break;
    case 1:
      local_98.m_words[0] =
           (uVar18 + uVar27 * 2 | uVar9 << 4) | uVar15 |
           (ulong)(uVar21 << 5) |
           (ulong)(uVar16 << 6) | (ulong)(uVar6 << 7) | (ulong)(uVar13 << 8) | (ulong)bVar31 << 10 |
           4;
      break;
    case 2:
      local_98.m_words[0] =
           (uVar18 + uVar27 * 2 | uVar9 << 4) | uVar15 |
           (ulong)(uVar21 << 5) |
           (ulong)(uVar16 << 6) | (ulong)(uVar6 << 7) | (ulong)(uVar13 << 8) | (ulong)bVar31 << 10 |
           8;
      break;
    case 3:
      local_98.m_words[0] =
           (ulong)(uVar9 * 0x10 + uVar27 * 2 | uVar18) | (ulong)uVar11 << 7 | (ulong)(uVar21 << 5) |
           (ulong)(uVar16 << 6) | (ulong)bVar31 << 10 | uVar15 | 0xc;
      break;
    case 4:
      local_98.m_words[0] =
           (ulong)(uVar9 * 0x10 + uVar27 * 2 | uVar21 << 5 | uVar18) | (ulong)uVar11 << 7 |
           (ulong)(uVar16 << 6) | (ulong)bVar31 << 10 | uVar15 | 0x10c;
      break;
    case 5:
      local_98.m_words[0] =
           ((ulong)(uVar9 << 4) | (ulong)(uVar21 << 5) | (ulong)(uVar16 << 6) | (ulong)bVar31 << 10)
           + uVar29 * 8 + uVar19 * 4 | uVar15;
      break;
    case 6:
      local_98.m_words[0] =
           uVar15 | ((ulong)(uVar9 << 4) |
                    (ulong)(uVar21 << 5) | (ulong)(uVar16 << 6) | (ulong)bVar31 << 10) + uVar29 * 8
                    + uVar19 * 4 | 0x80;
      break;
    case 7:
      local_98.m_words[0] =
           uVar15 | ((ulong)(uVar9 << 4) | (ulong)bVar31 << 10) + uVar29 * 8 + uVar19 * 4 | 0x180;
      break;
    case 8:
      local_98.m_words[0] =
           uVar15 | ((ulong)(uVar9 << 4) | (ulong)bVar31 << 10) + uVar29 * 8 + uVar19 * 4 | 0x1a0;
      break;
    case 9:
      local_98.m_words[0] =
           (Word)(uVar9 * 0x10 + uVar27 * 8 + uVar18 * 4 | uVar21 << 5 | uVar6 << 9 | uVar16 << 6 |
                  uVar13 << 10 | 0x100);
    }
  }
  iVar28 = blockParams->numPartitions;
  lVar23 = (long)iVar28;
  local_98.m_words[0] = (ulong)(iVar28 - 1) << 0xb | local_98.m_words[0] & 0xffffffffffffe7ff;
  if (1 < lVar23) {
    local_98.m_words[0] =
         (ulong)blockParams->partitionSeed << 0xd | local_98.m_words[0] & 0xffffffffff801fff;
  }
  iVar17 = 1;
  if ((iVar28 != 1) && (blockParams->isMultiPartSingleCemMode == false)) {
    if (iVar28 == 3) {
      iVar17 = -4;
    }
    else {
      iVar17 = -7;
      if (iVar28 != 4) {
        iVar17 = -(uint)(iVar28 == 2);
      }
    }
  }
  iVar12 = iVar17 - iVar14;
  pdVar1 = blockParams->colorEndpointModes;
  local_78 = blockParams;
  if (iVar28 == 1) {
    local_98.m_words[0] = local_98.m_words[0] & 0xfffffffffffe1fff;
    uVar29 = (ulong)*pdVar1 << 0xd;
LAB_0060f678:
    local_98.m_words[0] = uVar29 | local_98.m_words[0];
  }
  else {
    if (blockParams->isMultiPartSingleCemMode == true) {
      local_98.m_words[0] = local_98.m_words[0] & 0xffffffffe07fffff;
      uVar29 = (ulong)*pdVar1 << 0x19;
      goto LAB_0060f678;
    }
    pdVar20 = pdVar1;
    if (iVar28 != 0) {
      pdVar10 = blockParams->colorEndpointModes;
      lVar7 = lVar23 * 4 + -4;
      pdVar22 = pdVar1;
      do {
        pdVar10 = pdVar10 + 1;
        pdVar20 = pdVar10;
        if (*pdVar10 <= *pdVar22) {
          pdVar20 = pdVar22;
        }
        lVar7 = lVar7 + -4;
        pdVar22 = pdVar20;
      } while (lVar7 != 0);
    }
    uVar11 = (*pdVar20 >> 2) + (uint)(*pdVar20 >> 2 == 0);
    local_98.m_words[0] = (ulong)uVar11 << 0x17 | local_98.m_words[0] & 0xfffffffffe7fffff;
    if (0 < iVar28) {
      lVar7 = 0;
      uVar6 = 0x19;
      do {
        uVar9 = *(uint *)((long)pdVar1 + lVar7 * 2);
        uVar13 = uVar6 + 0x3f;
        if (-1 < (int)uVar6) {
          uVar13 = uVar6;
        }
        iVar2 = (int)lVar7;
        uVar16 = iVar28 + iVar2;
        local_98.m_words[(int)uVar13 >> 6] =
             (ulong)(uVar9 >> 2 == uVar11) << ((byte)uVar6 & 0x3f) |
             local_98.m_words[(int)uVar13 >> 6] & ~(1L << ((ulong)uVar6 & 0x3f));
        iVar26 = iVar12 + 0x7b;
        if (uVar16 < 4) {
          iVar26 = 0x19;
        }
        uVar18 = uVar16 + iVar26;
        uVar13 = iVar26 + uVar16 + 0x3f;
        if (-1 < (int)uVar18) {
          uVar13 = uVar18;
        }
        local_98.m_words[(int)uVar13 >> 6] =
             (ulong)(uVar9 & 1) << ((byte)uVar18 & 0x3f) |
             local_98.m_words[(int)uVar13 >> 6] & ~(1L << ((ulong)uVar18 & 0x3f));
        iVar26 = iVar28 + 0x1a;
        if (3 < iVar28 + iVar2 + 1U) {
          iVar26 = ((iVar17 + iVar28) - iVar14) + 0x7c;
        }
        uVar13 = iVar26 + iVar2;
        uVar16 = uVar13 + 0x3f;
        if (-1 < (int)uVar13) {
          uVar16 = uVar13;
        }
        local_98.m_words[(int)uVar16 >> 6] =
             (ulong)(uVar9 >> 1 & 1) << ((byte)uVar13 & 0x3f) |
             local_98.m_words[(int)uVar16 >> 6] & ~(1L << ((ulong)uVar13 & 0x3f));
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 2;
      } while (lVar23 * 2 != lVar7);
    }
  }
  pNVar4 = local_78;
  if (local_80 != 0) {
    AssignBlock128::setBits(&local_98,iVar12 + 0x7d,iVar12 + 0x7e,local_78->ccs);
  }
  pIVar5 = local_40;
  iVar28 = (int)local_68;
  if (local_6c == ISEMODE_PLAIN_BIT) {
    local_60.m_length = (pNVar4->weightISEParams).numBits * iVar28;
  }
  else {
    if (local_6c == ISEMODE_QUINT) {
      iVar17 = (iVar28 * 7) / 3;
      bVar31 = iVar28 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      local_60.m_length = -1;
      if (local_6c != ISEMODE_TRIT) goto LAB_0060f8a7;
      iVar17 = (iVar28 * 8) / 5;
      bVar31 = iVar28 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    local_60.m_length = (pNVar4->weightISEParams).numBits * iVar28 + ((iVar17 + 1) - (uint)bVar31);
  }
LAB_0060f8a7:
  local_60.m_startNdxInSrc = 0x7f;
  local_60.m_forward = false;
  local_60.m_ndx = 0;
  local_60.m_dst = &local_98;
  encodeISE(&local_60,local_48,local_40,iVar28);
  uVar11 = pNVar4->numPartitions;
  uVar29 = (ulong)uVar11;
  if (pNVar4->isMultiPartSingleCemMode == false) {
    if ((int)uVar11 < 1) {
      iVar28 = 0;
    }
    else {
      uVar15 = 0;
      iVar28 = 0;
      do {
        iVar28 = iVar28 + (pdVar1[uVar15] >> 2) * 2 + 2;
        uVar15 = uVar15 + 1;
      } while (uVar29 != uVar15);
    }
  }
  else {
    iVar28 = ((*pdVar1 >> 2) * 2 + 2) * uVar11;
  }
  IVar3 = (local_78->weightISEParams).mode;
  iVar17 = local_78->weightGridHeight * local_78->weightGridWidth << (local_78->isDualPlane & 0x1fU)
  ;
  if (IVar3 == ISEMODE_PLAIN_BIT) {
    iVar14 = iVar17 * (local_78->weightISEParams).numBits;
  }
  else {
    if (IVar3 == ISEMODE_QUINT) {
      iVar14 = (iVar17 * 7) / 3;
      bVar31 = iVar17 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar14 = -1;
      if (IVar3 != ISEMODE_TRIT) goto LAB_0060f9d3;
      iVar14 = (iVar17 * 8) / 5;
      bVar31 = iVar17 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar14 = iVar17 * (local_78->weightISEParams).numBits + ((iVar14 + 1) - (uint)bVar31);
  }
LAB_0060f9d3:
  iVar17 = -0x1d;
  if (pNVar4->isMultiPartSingleCemMode == false) {
    iVar17 = uVar11 * -3 + -0x19;
  }
  iVar12 = -0x11;
  if (uVar29 != 1) {
    iVar12 = iVar17;
  }
  iVar12 = ((uint)(local_78->isDualPlane ^ 1) * 2 - iVar14) + 0x7e + iVar12;
  iVar17 = 0x1d;
  if (uVar29 == 1) {
    iVar17 = 0x11;
  }
  local_38 = computeMaximumRangeISEParams(iVar12,iVar28);
  local_60.m_forward = true;
  local_60.m_ndx = 0;
  local_60.m_dst = &local_98;
  local_60.m_startNdxInSrc = iVar17;
  local_60.m_length = iVar12;
  encodeISE(&local_60,&local_38,pIVar5 + 1,iVar28);
  AVar32.m_words[0] = local_98.m_words[0];
  AVar32.m_words[1] = local_98.m_words[1];
  return (AssignBlock128)AVar32.m_words;
}

Assistant:

AssignBlock128 (void)
	{
		for (int wordNdx = 0; wordNdx < NUM_WORDS; wordNdx++)
			m_words[wordNdx] = 0;
	}